

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

RequiredError *
CLI::RequiredError::Subcommand(RequiredError *__return_storage_ptr__,size_t min_subcom)

{
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  uint uVar6;
  _Alloc_hider _Var7;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (min_subcom == 1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"A subcommand","");
    RequiredError(__return_storage_ptr__,&local_40);
    local_60.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    _Var7._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    uVar6 = 1;
    if (9 < min_subcom) {
      sVar4 = min_subcom;
      uVar2 = 4;
      do {
        uVar6 = uVar2;
        if (sVar4 < 100) {
          uVar6 = uVar6 - 2;
          goto LAB_001bb2ef;
        }
        if (sVar4 < 1000) {
          uVar6 = uVar6 - 1;
          goto LAB_001bb2ef;
        }
        if (sVar4 < 10000) goto LAB_001bb2ef;
        bVar1 = 99999 < sVar4;
        sVar4 = sVar4 / 10000;
        uVar2 = uVar6 + 4;
      } while (bVar1);
      uVar6 = uVar6 + 1;
    }
LAB_001bb2ef:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_60,(ulong)uVar6,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_60._M_dataplus._M_p,(uint)local_60._M_string_length,min_subcom);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_60,0,0,"Requires at least ",0x12);
    local_a0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar5) {
      local_a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_a0._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_a0," subcommands");
    local_80._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar5 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar5) {
      local_80.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_80._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    RequiredError(__return_storage_ptr__,&local_80,RequiredError);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    _Var7._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var7._M_p,local_60.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

static RequiredError Subcommand(std::size_t min_subcom) {
        if(min_subcom == 1) {
            return RequiredError("A subcommand");
        }
        return {"Requires at least " + std::to_string(min_subcom) + " subcommands", ExitCodes::RequiredError};
    }